

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

void rngStepR(void *buf,size_t count,void *state)

{
  err_t eVar1;
  ulong in_RSI;
  size_t pos;
  size_t r;
  size_t read;
  char *sources [5];
  undefined7 in_stack_ffffffffffffff98;
  void *buf_00;
  size_t *in_stack_ffffffffffffffa8;
  ulong local_50;
  undefined1 local_48 [24];
  void *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  
  memcpy(local_48,&PTR_anon_var_dwarf_23a5_00187d40,0x28);
  mtMtxLock((mt_mtx_t *)0x11cea5);
  buf_00 = (void *)0x0;
  for (local_50 = 0; local_50 < in_RSI && buf_00 < (void *)0x5;
      local_50 = (long)in_stack_ffffffffffffffa8 + local_50) {
    eVar1 = rngESRead(in_stack_ffffffffffffffa8,buf_00,
                      CONCAT17(local_50 < in_RSI && buf_00 < (void *)0x5,in_stack_ffffffffffffff98),
                      (char *)0x11cf08);
    if (eVar1 != 0) {
      in_stack_ffffffffffffffa8 = (size_t *)0x0;
    }
    buf_00 = (void *)((long)buf_00 + 1);
  }
  brngCTRStepR(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  mtMtxUnlock((mt_mtx_t *)0x11cf76);
  return;
}

Assistant:

void rngStepR(void* buf, size_t count, void* state)
{
	const char* sources[] = {"trng", "trng2", "sys", "sys2", "timer"};
	size_t read, r, pos;
	// блокировать мьютекс
	ASSERT(_inited);
	mtMtxLock(_mtx);
	// опросить источники
	read = pos = 0;
	while (read < count && pos < COUNT_OF(sources))
	{
		if (rngESRead(&r, (octet*)buf + read, count - read,
				sources[pos]) != ERR_OK)
			r = 0;
		read += r, ++pos;
	}
	read = r = pos = 0;
	// генерация
	ASSERT(rngIsValid_internal());
	brngCTRStepR(buf, count, _state->alg_state);
	// снять блокировку
	mtMtxUnlock(_mtx);
}